

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void extents_traverse_func
               (void *closure,plutovg_path_command_t command,plutovg_point_t *points,int npoints)

{
  plutovg_point_t pVar1;
  float fVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  
  if (*(char *)((long)closure + 8) == '\0') {
    uVar3 = 0;
    uVar4 = (ulong)(uint)npoints;
    if (npoints < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      fVar9 = points[uVar3 + 1].x;
      fVar2 = points[uVar3 + 1].y;
      uVar5 = -(uint)(*(float *)((long)closure + 0x10) < fVar9);
      uVar6 = -(uint)(*(float *)((long)closure + 0x14) < fVar2);
      uVar7 = -(uint)(fVar9 < *(float *)((long)closure + 0x18));
      uVar8 = -(uint)(fVar2 < *(float *)((long)closure + 0x1c));
      *(uint *)((long)closure + 0x10) =
           ~uVar5 & (uint)fVar9 | (uint)*(float *)((long)closure + 0x10) & uVar5;
      *(uint *)((long)closure + 0x14) =
           ~uVar6 & (uint)fVar2 | (uint)*(float *)((long)closure + 0x14) & uVar6;
      *(uint *)((long)closure + 0x18) =
           ~uVar7 & (uint)fVar9 | (uint)*(float *)((long)closure + 0x18) & uVar7;
      *(uint *)((long)closure + 0x1c) =
           ~uVar8 & (uint)fVar2 | (uint)*(float *)((long)closure + 0x1c) & uVar8;
      if (command != PLUTOVG_PATH_COMMAND_MOVE_TO) {
        fVar9 = hypotf(fVar9 - *closure,fVar2 - *(float *)((long)closure + 4));
        *(float *)((long)closure + 0xc) = fVar9 + *(float *)((long)closure + 0xc);
      }
      *(plutovg_point_t *)closure = points[uVar3];
    }
  }
  else {
    if (command != PLUTOVG_PATH_COMMAND_MOVE_TO) {
      __assert_fail("command == PLUTOVG_PATH_COMMAND_MOVE_TO",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-path.c"
                    ,0x2a8,
                    "void extents_traverse_func(void *, plutovg_path_command_t, const plutovg_point_t *, int)"
                   );
    }
    *(undefined1 *)((long)closure + 8) = 0;
    *(plutovg_point_t *)closure = *points;
    pVar1 = *points;
    *(plutovg_point_t *)((long)closure + 0x10) = pVar1;
    *(plutovg_point_t *)((long)closure + 0x18) = pVar1;
    *(undefined4 *)((long)closure + 0xc) = 0;
  }
  return;
}

Assistant:

static void extents_traverse_func(void* closure, plutovg_path_command_t command, const plutovg_point_t* points, int npoints)
{
    extents_calculator_t* calculator = (extents_calculator_t*)(closure);
    if(calculator->is_first_point) {
        assert(command == PLUTOVG_PATH_COMMAND_MOVE_TO);
        calculator->is_first_point = false;
        calculator->current_point = points[0];
        calculator->x1 = points[0].x;
        calculator->y1 = points[0].y;
        calculator->x2 = points[0].x;
        calculator->y2 = points[0].y;
        calculator->length = 0;
        return;
    }

    for(int i = 0; i < npoints; ++i) {
        calculator->x1 = plutovg_min(calculator->x1, points[i].x);
        calculator->y1 = plutovg_min(calculator->y1, points[i].y);
        calculator->x2 = plutovg_max(calculator->x2, points[i].x);
        calculator->y2 = plutovg_max(calculator->y2, points[i].y);
        if(command != PLUTOVG_PATH_COMMAND_MOVE_TO)
            calculator->length += hypotf(points[i].x - calculator->current_point.x, points[i].y - calculator->current_point.y);
        calculator->current_point = points[i];
    }
}